

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test1::initTest(GPUShaderFP64Test1 *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  GLint link_status;
  GLint compile_status;
  char *vs_body;
  int local_38;
  int local_34;
  char *local_30;
  long lVar5;
  
  local_34 = 0;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  local_38 = 0;
  local_30 = 
  "#version 400\n\nuniform bool      uniform_bool;\nuniform bvec2     uniform_bvec2;\nuniform bvec3     uniform_bvec3;\nuniform bvec4     uniform_bvec4;\nuniform dmat2     uniform_dmat2;\nuniform dmat2x3   uniform_dmat2x3;\nuniform dmat2x4   uniform_dmat2x4;\nuniform dmat3     uniform_dmat3;\nuniform dmat3x2   uniform_dmat3x2;\nuniform dmat3x4   uniform_dmat3x4;\nuniform dmat4     uniform_dmat4;\nuniform dmat4x2   uniform_dmat4x2;\nuniform dmat4x3   uniform_dmat4x3;\nuniform double    uniform_double;\nuniform dvec2     uniform_dvec2;\nuniform dvec3     uniform_dvec3;\nuniform dvec4     uniform_dvec4;\nuniform float     uniform_float;\nuniform int       uniform_int;\nuniform ivec2     uniform_ivec2;\nuniform ivec3     uniform_ivec3;\nuniform ivec4     uniform_ivec4;\nuniform sampler2D uniform_sampler;\nuniform uint      uniform_uint;\nuniform uvec2     uniform_uvec2;\nuniform uvec3     uniform_uvec3;\nuniform uvec4     uniform_uvec4;\nuniform vec2      uniform_vec2;\nuniform vec3      uniform_vec3;\nuniform vec4      uniform_vec4;\nuniform bool      uniform_bool_arr   [2];\nuniform bvec2     uniform_bvec2_arr  [2];\nuniform bvec3     uniform_bvec3_arr  [2];\nuniform bvec4     uniform_bvec4_arr  [2];\nuniform dmat2     uniform_dmat2_arr  [2];\nuniform dmat2x3   uniform_dmat2x3_arr[2];\nuniform dmat2x4   uniform_dmat2x4_arr[2];\nuniform dmat3     uniform_dmat3_arr  [2];\nuniform dmat3x2   uniform_dmat3x2_arr[2];\nuniform dmat3x4   uniform_dmat3x4_arr[2];\nuniform dmat4     uniform_dmat4_arr  [2];\nuniform dmat4x2   uniform_dmat4x2_arr[2];\nuniform dmat4x3   uniform_dmat4x3_arr[2];\nuniform double    uniform_double_arr [2];\nuniform dvec2     uniform_dvec2_arr  [2];\nuniform dvec3     uniform_dvec3_arr  [2];\nuniform dvec4     uniform_dvec4_arr  [2];\nuniform float     uniform_float_arr  [2];\nuniform int       uniform_int_arr    [2];\nuniform ivec2     uniform_ivec2_arr  [2];\nuniform ivec3     uniform_ivec3_arr  [2];\nuniform ivec4     uniform_ivec4_arr  [2];\nuniform uint      uniform_uint_arr   [2];\nuniform uvec2     uniform_uvec2_arr  [2];\nuniform uvec3     uniform_uv..." /* TRUNCATED STRING LITERAL */
  ;
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x7c1);
  GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x7c4);
  (**(code **)(lVar5 + 0x12b8))(this->m_vs_id,1,&local_30,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x7c7);
  (**(code **)(lVar5 + 0x248))(this->m_vs_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x7ca);
  (**(code **)(lVar5 + 0xa70))(this->m_vs_id,0x8b81,&local_34);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x7cd);
  if (local_34 == 1) {
    (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x7d5);
    (**(code **)(lVar5 + 0xce8))(this->m_po_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x7d8);
    (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82,&local_38);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x7db);
    if (local_38 == 1) {
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bool_arr[0]");
      this->m_po_bool_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bool");
      this->m_po_bool_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bvec2_arr[0]");
      this->m_po_bvec2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bvec2");
      this->m_po_bvec2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bvec3_arr[0]");
      this->m_po_bvec3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bvec3");
      this->m_po_bvec3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bvec4_arr[0]");
      this->m_po_bvec4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_bvec4");
      this->m_po_bvec4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat2_arr[0]");
      this->m_po_dmat2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat2");
      this->m_po_dmat2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat2x3_arr[0]");
      this->m_po_dmat2x3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat2x3");
      this->m_po_dmat2x3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat2x4_arr[0]");
      this->m_po_dmat2x4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat2x4");
      this->m_po_dmat2x4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat3_arr[0]");
      this->m_po_dmat3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat3");
      this->m_po_dmat3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat3x2_arr[0]");
      this->m_po_dmat3x2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat3x2");
      this->m_po_dmat3x2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat3x4_arr[0]");
      this->m_po_dmat3x4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat3x4");
      this->m_po_dmat3x4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat4_arr[0]");
      this->m_po_dmat4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat4");
      this->m_po_dmat4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat4x2_arr[0]");
      this->m_po_dmat4x2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat4x2");
      this->m_po_dmat4x2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat4x3_arr[0]");
      this->m_po_dmat4x3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dmat4x3");
      this->m_po_dmat4x3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_double_arr[0]");
      this->m_po_double_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_double");
      this->m_po_double_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dvec2_arr[0]");
      this->m_po_dvec2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dvec2");
      this->m_po_dvec2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dvec3_arr[0]");
      this->m_po_dvec3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dvec3");
      this->m_po_dvec3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dvec4_arr[0]");
      this->m_po_dvec4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_dvec4");
      this->m_po_dvec4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_float_arr[0]");
      this->m_po_float_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_float");
      this->m_po_float_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_int_arr[0]");
      this->m_po_int_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_int");
      this->m_po_int_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_ivec2_arr[0]");
      this->m_po_ivec2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_ivec2");
      this->m_po_ivec2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_ivec3_arr[0]");
      this->m_po_ivec3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_ivec3");
      this->m_po_ivec3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_ivec4_arr[0]");
      this->m_po_ivec4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_ivec4");
      this->m_po_ivec4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_sampler");
      this->m_po_sampler_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uint_arr[0]");
      this->m_po_uint_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uint");
      this->m_po_uint_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uvec2_arr[0]");
      this->m_po_uvec2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uvec2");
      this->m_po_uvec2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uvec3_arr[0]");
      this->m_po_uvec3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uvec3");
      this->m_po_uvec3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uvec4_arr[0]");
      this->m_po_uvec4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_uvec4");
      this->m_po_uvec4_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_vec2_arr[0]");
      this->m_po_vec2_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_vec2");
      this->m_po_vec2_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_vec3_arr[0]");
      this->m_po_vec3_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_vec3");
      this->m_po_vec3_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_vec4_arr[0]");
      this->m_po_vec4_arr_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"uniform_vec4");
      this->m_po_vec4_uniform_location = GVar4;
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGetUniformLocation() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x81d);
      auVar18._0_4_ = -(uint)(this->m_po_dmat3x2_arr_uniform_location == -1);
      auVar18._4_4_ = -(uint)(this->m_po_dmat3x2_uniform_location == -1);
      auVar18._8_4_ = -(uint)(this->m_po_dmat3x4_arr_uniform_location == -1);
      auVar18._12_4_ = -(uint)(this->m_po_dmat3x4_uniform_location == -1);
      auVar6._0_4_ = -(uint)(this->m_po_bool_arr_uniform_location == -1);
      auVar6._4_4_ = -(uint)(this->m_po_bool_uniform_location == -1);
      auVar6._8_4_ = -(uint)(this->m_po_bvec2_arr_uniform_location == -1);
      auVar6._12_4_ = -(uint)(this->m_po_bvec2_uniform_location == -1);
      auVar11._0_4_ = -(uint)(this->m_po_dmat4_arr_uniform_location == -1);
      auVar11._4_4_ = -(uint)(this->m_po_dmat4_uniform_location == -1);
      auVar11._8_4_ = -(uint)(this->m_po_dmat4x2_arr_uniform_location == -1);
      auVar11._12_4_ = -(uint)(this->m_po_dmat4x2_uniform_location == -1);
      auVar16._0_4_ = -(uint)(this->m_po_bvec3_arr_uniform_location == -1);
      auVar16._4_4_ = -(uint)(this->m_po_bvec3_uniform_location == -1);
      auVar16._8_4_ = -(uint)(this->m_po_bvec4_arr_uniform_location == -1);
      auVar16._12_4_ = -(uint)(this->m_po_bvec4_uniform_location == -1);
      auVar6 = packssdw(auVar6 | auVar18,auVar16 | auVar11);
      auVar13._0_4_ = -(uint)(this->m_po_dmat4x3_arr_uniform_location == -1);
      auVar13._4_4_ = -(uint)(this->m_po_dmat4x3_uniform_location == -1);
      auVar13._8_4_ = -(uint)(this->m_po_double_arr_uniform_location == -1);
      auVar13._12_4_ = -(uint)(this->m_po_double_uniform_location == -1);
      auVar17._0_4_ = -(uint)(this->m_po_dmat2_arr_uniform_location == -1);
      auVar17._4_4_ = -(uint)(this->m_po_dmat2_uniform_location == -1);
      auVar17._8_4_ = -(uint)(this->m_po_dmat2x3_arr_uniform_location == -1);
      auVar17._12_4_ = -(uint)(this->m_po_dmat2x3_uniform_location == -1);
      auVar15._0_4_ = -(uint)(this->m_po_dvec2_arr_uniform_location == -1);
      auVar15._4_4_ = -(uint)(this->m_po_dvec2_uniform_location == -1);
      auVar15._8_4_ = -(uint)(this->m_po_dvec3_arr_uniform_location == -1);
      auVar15._12_4_ = -(uint)(this->m_po_dvec3_uniform_location == -1);
      auVar19._0_4_ = -(uint)(this->m_po_dmat2x4_arr_uniform_location == -1);
      auVar19._4_4_ = -(uint)(this->m_po_dmat2x4_uniform_location == -1);
      auVar19._8_4_ = -(uint)(this->m_po_dmat3_arr_uniform_location == -1);
      auVar19._12_4_ = -(uint)(this->m_po_dmat3_uniform_location == -1);
      auVar18 = packssdw(auVar17 | auVar13,auVar19 | auVar15);
      auVar6 = packsswb(auVar6,auVar18);
      if ((((((((((((((((auVar6 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar6 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar6 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar6 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar6 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar6 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar6 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar6 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar6 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar6 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf]) {
        auVar7._0_4_ = -(uint)(this->m_po_sampler_uniform_location == -1);
        auVar7._4_4_ = -(uint)(this->m_po_uint_arr_uniform_location == -1);
        auVar7._8_4_ = -(uint)(this->m_po_uint_uniform_location == -1);
        auVar7._12_4_ = -(uint)(this->m_po_uvec2_arr_uniform_location == -1);
        auVar9._0_4_ = -(uint)(this->m_po_ivec3_arr_uniform_location == -1);
        auVar9._4_4_ = -(uint)(this->m_po_ivec3_uniform_location == -1);
        auVar9._8_4_ = -(uint)(this->m_po_ivec4_arr_uniform_location == -1);
        auVar9._12_4_ = -(uint)(this->m_po_ivec4_uniform_location == -1);
        auVar6 = packssdw(auVar9,auVar7);
        auVar12._0_4_ = -(uint)(this->m_po_int_arr_uniform_location == -1);
        auVar12._4_4_ = -(uint)(this->m_po_int_uniform_location == -1);
        auVar12._8_4_ = -(uint)(this->m_po_ivec2_arr_uniform_location == -1);
        auVar12._12_4_ = -(uint)(this->m_po_ivec2_uniform_location == -1);
        auVar14._0_4_ = -(uint)(this->m_po_dvec4_arr_uniform_location == -1);
        auVar14._4_4_ = -(uint)(this->m_po_dvec4_uniform_location == -1);
        auVar14._8_4_ = -(uint)(this->m_po_float_arr_uniform_location == -1);
        auVar14._12_4_ = -(uint)(this->m_po_float_uniform_location == -1);
        auVar18 = packssdw(auVar14,auVar12);
        auVar6 = packsswb(auVar18,auVar6);
        if ((((((((((((((((auVar6 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar6 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar6 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar6 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar6 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar6 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar6 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar6 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar6 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar6 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf])
        {
          auVar8._0_4_ = -(uint)(this->m_po_uvec4_uniform_location == -1);
          auVar8._4_4_ = -(uint)(this->m_po_vec2_arr_uniform_location == -1);
          auVar8._8_4_ = -(uint)(this->m_po_vec2_uniform_location == -1);
          auVar8._12_4_ = -(uint)(this->m_po_vec3_arr_uniform_location == -1);
          auVar10._0_4_ = -(uint)(this->m_po_uvec2_uniform_location == -1);
          auVar10._4_4_ = -(uint)(this->m_po_uvec3_arr_uniform_location == -1);
          auVar10._8_4_ = -(uint)(this->m_po_uvec3_uniform_location == -1);
          auVar10._12_4_ = -(uint)(this->m_po_uvec4_arr_uniform_location == -1);
          auVar6 = packssdw(auVar10,auVar8);
          auVar6 = packsswb(auVar6,auVar6);
          if (((((((((((auVar6 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar6 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar6 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar6 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (this->m_po_vec3_uniform_location != -1)) &&
              (this->m_po_vec4_arr_uniform_location != -1)) &&
             (this->m_po_vec4_uniform_location != -1)) {
            return;
          }
        }
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"At last one of the required uniforms is considered inactive.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x83d);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Program linking failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x7df);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x7d1);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GPUShaderFP64Test1::initTest()
{
	glw::GLint			  compile_status = GL_FALSE;
	const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();
	glw::GLint			  link_status	= GL_FALSE;

	/* Set up a program object using all new double-precision types */
	const char* vs_body =
		"#version 400\n"
		"\n"
		"uniform bool      uniform_bool;\n"
		"uniform bvec2     uniform_bvec2;\n"
		"uniform bvec3     uniform_bvec3;\n"
		"uniform bvec4     uniform_bvec4;\n"
		"uniform dmat2     uniform_dmat2;\n"
		"uniform dmat2x3   uniform_dmat2x3;\n"
		"uniform dmat2x4   uniform_dmat2x4;\n"
		"uniform dmat3     uniform_dmat3;\n"
		"uniform dmat3x2   uniform_dmat3x2;\n"
		"uniform dmat3x4   uniform_dmat3x4;\n"
		"uniform dmat4     uniform_dmat4;\n"
		"uniform dmat4x2   uniform_dmat4x2;\n"
		"uniform dmat4x3   uniform_dmat4x3;\n"
		"uniform double    uniform_double;\n"
		"uniform dvec2     uniform_dvec2;\n"
		"uniform dvec3     uniform_dvec3;\n"
		"uniform dvec4     uniform_dvec4;\n"
		"uniform float     uniform_float;\n"
		"uniform int       uniform_int;\n"
		"uniform ivec2     uniform_ivec2;\n"
		"uniform ivec3     uniform_ivec3;\n"
		"uniform ivec4     uniform_ivec4;\n"
		"uniform sampler2D uniform_sampler;\n"
		"uniform uint      uniform_uint;\n"
		"uniform uvec2     uniform_uvec2;\n"
		"uniform uvec3     uniform_uvec3;\n"
		"uniform uvec4     uniform_uvec4;\n"
		"uniform vec2      uniform_vec2;\n"
		"uniform vec3      uniform_vec3;\n"
		"uniform vec4      uniform_vec4;\n"
		"uniform bool      uniform_bool_arr   [2];\n"
		"uniform bvec2     uniform_bvec2_arr  [2];\n"
		"uniform bvec3     uniform_bvec3_arr  [2];\n"
		"uniform bvec4     uniform_bvec4_arr  [2];\n"
		"uniform dmat2     uniform_dmat2_arr  [2];\n"
		"uniform dmat2x3   uniform_dmat2x3_arr[2];\n"
		"uniform dmat2x4   uniform_dmat2x4_arr[2];\n"
		"uniform dmat3     uniform_dmat3_arr  [2];\n"
		"uniform dmat3x2   uniform_dmat3x2_arr[2];\n"
		"uniform dmat3x4   uniform_dmat3x4_arr[2];\n"
		"uniform dmat4     uniform_dmat4_arr  [2];\n"
		"uniform dmat4x2   uniform_dmat4x2_arr[2];\n"
		"uniform dmat4x3   uniform_dmat4x3_arr[2];\n"
		"uniform double    uniform_double_arr [2];\n"
		"uniform dvec2     uniform_dvec2_arr  [2];\n"
		"uniform dvec3     uniform_dvec3_arr  [2];\n"
		"uniform dvec4     uniform_dvec4_arr  [2];\n"
		"uniform float     uniform_float_arr  [2];\n"
		"uniform int       uniform_int_arr    [2];\n"
		"uniform ivec2     uniform_ivec2_arr  [2];\n"
		"uniform ivec3     uniform_ivec3_arr  [2];\n"
		"uniform ivec4     uniform_ivec4_arr  [2];\n"
		"uniform uint      uniform_uint_arr   [2];\n"
		"uniform uvec2     uniform_uvec2_arr  [2];\n"
		"uniform uvec3     uniform_uvec3_arr  [2];\n"
		"uniform uvec4     uniform_uvec4_arr  [2];\n"
		"uniform vec2      uniform_vec2_arr   [2];\n"
		"uniform vec3      uniform_vec3_arr   [2];\n"
		"uniform vec4      uniform_vec4_arr   [2];\n"
		"\n"
		"void main()\n"
		"{\n"
		"    gl_Position = vec4(0) + texture(uniform_sampler, vec2(0) );\n"
		"\n"
		"    if (uniform_bool        && uniform_bvec2.y        && uniform_bvec3.z        && uniform_bvec4.w        &&\n"
		"        uniform_bool_arr[1] && uniform_bvec2_arr[1].y && uniform_bvec3_arr[1].z && uniform_bvec4_arr[1].w)\n"
		"    {\n"
		"        double sum = uniform_dmat2       [0].x + uniform_dmat2x3       [0].x + uniform_dmat2x4       [0].x +\n"
		"                     uniform_dmat3       [0].x + uniform_dmat3x2       [0].x + uniform_dmat3x4       [0].x +\n"
		"                     uniform_dmat4       [0].x + uniform_dmat4x2       [0].x + uniform_dmat4x3       [0].x +\n"
		"                     uniform_dmat2_arr[0][0].x + uniform_dmat2x3_arr[0][0].x + uniform_dmat2x4_arr[0][0].x +\n"
		"                     uniform_dmat3_arr[0][0].x + uniform_dmat3x2_arr[0][0].x + uniform_dmat3x4_arr[0][0].x +\n"
		"                     uniform_dmat4_arr[0][0].x + uniform_dmat4x2_arr[0][0].x + uniform_dmat4x3_arr[0][0].x +\n"
		"                     uniform_double            + uniform_double_arr [0]      +\n"
		"                     uniform_dvec2.x           + uniform_dvec3.x             + uniform_dvec4.x        +\n"
		"                     uniform_dvec2_arr[0].x    + uniform_dvec3_arr[0].x      + uniform_dvec4_arr[0].x;\n"
		"        int   sum2 = uniform_int               + uniform_ivec2.x             + uniform_ivec3.x        +\n"
		"                     uniform_ivec4.x           + uniform_ivec2_arr[0].x      + uniform_ivec3_arr[0].x +\n"
		"                     uniform_ivec4_arr[0].x    + uniform_int_arr[0];\n"
		"        uint  sum3 = uniform_uint              + uniform_uvec2.x             + uniform_uvec3.x        +\n"
		"                     uniform_uvec4.x           + uniform_uint_arr[0]         + uniform_uvec2_arr[0].x +\n"
		"                     uniform_uvec3_arr[0].x    + uniform_uvec4_arr[0].x;\n"
		"        float sum4 = uniform_float             + uniform_float_arr[0]  + \n"
		"                     uniform_vec2.x            + uniform_vec2_arr[0].x + \n"
		"                     uniform_vec3.x            + uniform_vec3_arr[0].x + \n"
		"                     uniform_vec4.x            + uniform_vec4_arr[0].x;\n"
		"\n"
		"        if (sum * sum4 > intBitsToFloat(sum2) * uintBitsToFloat(sum3) )\n"
		"        {\n"
		"            gl_Position = vec4(1);\n"
		"        }\n"
		"    }\n"
		"}\n";

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status != GL_TRUE)
	{
		TCU_FAIL("Shader compilation failed.");
	}

	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	m_po_bool_arr_uniform_location	= gl.getUniformLocation(m_po_id, "uniform_bool_arr[0]");
	m_po_bool_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_bool");
	m_po_bvec2_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_bvec2_arr[0]");
	m_po_bvec2_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_bvec2");
	m_po_bvec3_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_bvec3_arr[0]");
	m_po_bvec3_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_bvec3");
	m_po_bvec4_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_bvec4_arr[0]");
	m_po_bvec4_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_bvec4");
	m_po_dmat2_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_dmat2_arr[0]");
	m_po_dmat2_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_dmat2");
	m_po_dmat2x3_arr_uniform_location = gl.getUniformLocation(m_po_id, "uniform_dmat2x3_arr[0]");
	m_po_dmat2x3_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_dmat2x3");
	m_po_dmat2x4_arr_uniform_location = gl.getUniformLocation(m_po_id, "uniform_dmat2x4_arr[0]");
	m_po_dmat2x4_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_dmat2x4");
	m_po_dmat3_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_dmat3_arr[0]");
	m_po_dmat3_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_dmat3");
	m_po_dmat3x2_arr_uniform_location = gl.getUniformLocation(m_po_id, "uniform_dmat3x2_arr[0]");
	m_po_dmat3x2_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_dmat3x2");
	m_po_dmat3x4_arr_uniform_location = gl.getUniformLocation(m_po_id, "uniform_dmat3x4_arr[0]");
	m_po_dmat3x4_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_dmat3x4");
	m_po_dmat4_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_dmat4_arr[0]");
	m_po_dmat4_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_dmat4");
	m_po_dmat4x2_arr_uniform_location = gl.getUniformLocation(m_po_id, "uniform_dmat4x2_arr[0]");
	m_po_dmat4x2_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_dmat4x2");
	m_po_dmat4x3_arr_uniform_location = gl.getUniformLocation(m_po_id, "uniform_dmat4x3_arr[0]");
	m_po_dmat4x3_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_dmat4x3");
	m_po_double_arr_uniform_location  = gl.getUniformLocation(m_po_id, "uniform_double_arr[0]");
	m_po_double_uniform_location	  = gl.getUniformLocation(m_po_id, "uniform_double");
	m_po_dvec2_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_dvec2_arr[0]");
	m_po_dvec2_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_dvec2");
	m_po_dvec3_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_dvec3_arr[0]");
	m_po_dvec3_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_dvec3");
	m_po_dvec4_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_dvec4_arr[0]");
	m_po_dvec4_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_dvec4");
	m_po_float_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_float_arr[0]");
	m_po_float_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_float");
	m_po_int_arr_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_int_arr[0]");
	m_po_int_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_int");
	m_po_ivec2_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_ivec2_arr[0]");
	m_po_ivec2_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_ivec2");
	m_po_ivec3_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_ivec3_arr[0]");
	m_po_ivec3_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_ivec3");
	m_po_ivec4_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_ivec4_arr[0]");
	m_po_ivec4_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_ivec4");
	m_po_sampler_uniform_location	 = gl.getUniformLocation(m_po_id, "uniform_sampler");
	m_po_uint_arr_uniform_location	= gl.getUniformLocation(m_po_id, "uniform_uint_arr[0]");
	m_po_uint_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_uint");
	m_po_uvec2_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_uvec2_arr[0]");
	m_po_uvec2_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_uvec2");
	m_po_uvec3_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_uvec3_arr[0]");
	m_po_uvec3_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_uvec3");
	m_po_uvec4_arr_uniform_location   = gl.getUniformLocation(m_po_id, "uniform_uvec4_arr[0]");
	m_po_uvec4_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_uvec4");
	m_po_vec2_arr_uniform_location	= gl.getUniformLocation(m_po_id, "uniform_vec2_arr[0]");
	m_po_vec2_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_vec2");
	m_po_vec3_arr_uniform_location	= gl.getUniformLocation(m_po_id, "uniform_vec3_arr[0]");
	m_po_vec3_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_vec3");
	m_po_vec4_arr_uniform_location	= gl.getUniformLocation(m_po_id, "uniform_vec4_arr[0]");
	m_po_vec4_uniform_location		  = gl.getUniformLocation(m_po_id, "uniform_vec4");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed.");

	if (m_po_bool_arr_uniform_location == -1 || m_po_bool_uniform_location == -1 ||
		m_po_bvec2_arr_uniform_location == -1 || m_po_bvec2_uniform_location == -1 ||
		m_po_bvec3_arr_uniform_location == -1 || m_po_bvec3_uniform_location == -1 ||
		m_po_bvec4_arr_uniform_location == -1 || m_po_bvec4_uniform_location == -1 ||
		m_po_dmat2_arr_uniform_location == -1 || m_po_dmat2_uniform_location == -1 ||
		m_po_dmat2x3_arr_uniform_location == -1 || m_po_dmat2x3_uniform_location == -1 ||
		m_po_dmat2x4_arr_uniform_location == -1 || m_po_dmat2x4_uniform_location == -1 ||
		m_po_dmat3_arr_uniform_location == -1 || m_po_dmat3_uniform_location == -1 ||
		m_po_dmat3x2_arr_uniform_location == -1 || m_po_dmat3x2_uniform_location == -1 ||
		m_po_dmat3x4_arr_uniform_location == -1 || m_po_dmat3x4_uniform_location == -1 ||
		m_po_dmat4_arr_uniform_location == -1 || m_po_dmat4_uniform_location == -1 ||
		m_po_dmat4x2_arr_uniform_location == -1 || m_po_dmat4x2_uniform_location == -1 ||
		m_po_dmat4x3_arr_uniform_location == -1 || m_po_dmat4x3_uniform_location == -1 ||
		m_po_double_arr_uniform_location == -1 || m_po_double_uniform_location == -1 ||
		m_po_dvec2_arr_uniform_location == -1 || m_po_dvec2_uniform_location == -1 ||
		m_po_dvec3_arr_uniform_location == -1 || m_po_dvec3_uniform_location == -1 ||
		m_po_dvec4_arr_uniform_location == -1 || m_po_dvec4_uniform_location == -1 ||
		m_po_float_arr_uniform_location == -1 || m_po_float_uniform_location == -1 ||
		m_po_int_arr_uniform_location == -1 || m_po_int_uniform_location == -1 ||
		m_po_ivec2_arr_uniform_location == -1 || m_po_ivec2_uniform_location == -1 ||
		m_po_ivec3_arr_uniform_location == -1 || m_po_ivec3_uniform_location == -1 ||
		m_po_ivec4_arr_uniform_location == -1 || m_po_ivec4_uniform_location == -1 ||
		m_po_sampler_uniform_location == -1 || m_po_uint_arr_uniform_location == -1 ||
		m_po_uint_uniform_location == -1 || m_po_uvec2_arr_uniform_location == -1 ||
		m_po_uvec2_uniform_location == -1 || m_po_uvec3_arr_uniform_location == -1 ||
		m_po_uvec3_uniform_location == -1 || m_po_uvec4_arr_uniform_location == -1 ||
		m_po_uvec4_uniform_location == -1 || m_po_vec2_arr_uniform_location == -1 || m_po_vec2_uniform_location == -1 ||
		m_po_vec3_arr_uniform_location == -1 || m_po_vec3_uniform_location == -1 ||
		m_po_vec4_arr_uniform_location == -1 || m_po_vec4_uniform_location == -1)
	{
		TCU_FAIL("At last one of the required uniforms is considered inactive.");
	}
}